

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::finishSymmetryDetection
          (HighsMipSolverData *this,TaskGroup *taskGroup,
          unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
          *symData)

{
  uint uVar1;
  pointer pHVar2;
  long lVar3;
  ulong uVar4;
  HighsLogOptions *log_options_;
  HighsOrbitopeMatrix *orbitope;
  pointer this_00;
  undefined1 auStack_58 [16];
  string symmetry_time;
  
  ::highs::parallel::TaskGroup::sync(taskGroup);
  HighsSymmetries::operator=
            (&this->symmetries,
             &((symData->_M_t).
               super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
               .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>.
              _M_head_impl)->symmetries);
  if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).timeless_log == true) {
    std::__cxx11::string::string((string *)&symmetry_time,"",(allocator *)auStack_58);
  }
  else {
    highsFormatToString_abi_cxx11_
              (&symmetry_time," %.1fs",
               ((symData->_M_t).
                super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                ._M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>.
               _M_head_impl)->detectionTime);
  }
  highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "\nSymmetry detection completed in%s\n",symmetry_time._M_dataplus._M_p);
  if ((this->symmetries).numGenerators == 0) {
    this->detectSymmetries = false;
    highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "No symmetry present\n\n");
  }
  else {
    lVar3 = (long)(this->symmetries).orbitopes.
                  super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->symmetries).orbitopes.
                  super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar3 == 0) {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                   "Found %d generator(s)\n\n");
    }
    else {
      uVar4 = lVar3 / 0x68;
      log_options_ = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options;
      uVar1 = (this->symmetries).numPerms;
      if (uVar1 == 0) {
        highsLogUser(log_options_,kInfo,"Found %d full orbitope(s) acting on %d columns\n\n",
                     uVar4 & 0xffffffff,(ulong)(uint)(this->symmetries).columnToOrbitope.numElements
                    );
      }
      else {
        highsLogUser(log_options_,kInfo,
                     "Found %d generator(s) and %d full orbitope(s) acting on %d columns\n\n",
                     (ulong)uVar1,uVar4 & 0xffffffff);
      }
    }
  }
  std::
  __uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
  ::reset((__uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
           *)symData,(pointer)0x0);
  pHVar2 = (this->symmetries).orbitopes.
           super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->symmetries).orbitopes.
                 super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pHVar2; this_00 = this_00 + 1)
  {
    HighsOrbitopeMatrix::determineOrbitopeType(this_00,&this->cliquetable);
  }
  if ((this->symmetries).numPerms != 0) {
    HighsSymmetries::computeStabilizerOrbits
              ((HighsSymmetries *)auStack_58,(HighsDomain *)&this->symmetries);
    std::__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->globalOrbits).
                super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  }
  std::__cxx11::string::~string((string *)&symmetry_time);
  return;
}

Assistant:

void HighsMipSolverData::finishSymmetryDetection(
    const highs::parallel::TaskGroup& taskGroup,
    std::unique_ptr<SymmetryDetectionData>& symData) {
  taskGroup.sync();

  symmetries = std::move(symData->symmetries);
  std::string symmetry_time =
      mipsolver.options_mip_->timeless_log
          ? ""
          : highsFormatToString(" %.1fs", symData->detectionTime);
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "\nSymmetry detection completed in%s\n", symmetry_time.c_str());

  if (symmetries.numGenerators == 0) {
    detectSymmetries = false;
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "No symmetry present\n\n");
  } else if (symmetries.orbitopes.size() == 0) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Found %d generator(s)\n\n", int(symmetries.numGenerators));

  } else {
    if (symmetries.numPerms != 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d generator(s) and %d full orbitope(s) acting on %d "
                   "columns\n\n",
                   int(symmetries.numPerms), int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    } else {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d full orbitope(s) acting on %d columns\n\n",
                   int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    }
  }
  symData.reset();

  for (HighsOrbitopeMatrix& orbitope : symmetries.orbitopes)
    orbitope.determineOrbitopeType(cliquetable);

  if (symmetries.numPerms != 0)
    globalOrbits = symmetries.computeStabilizerOrbits(domain);
}